

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::~Shape(Shape *this)

{
  VertexArray *in_RDI;
  
  (in_RDI->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Shape_001d75c0;
  (in_RDI->m_vertices).super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__Shape_001d75f8;
  VertexBuffer::~VertexBuffer((VertexBuffer *)in_RDI);
  VertexBuffer::~VertexBuffer((VertexBuffer *)in_RDI);
  VertexArray::~VertexArray(in_RDI);
  VertexArray::~VertexArray(in_RDI);
  Transformable::~Transformable((Transformable *)&in_RDI->m_vertices);
  Drawable::~Drawable(&in_RDI->super_Drawable);
  return;
}

Assistant:

Shape::~Shape()
{
}